

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_2883f3::Transaction::Transaction(Transaction *this)

{
  shared_ptr<pstore::file::in_memory> *file;
  Transaction *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Transaction_003d5008;
  in_memory_store::in_memory_store(&this->store_);
  file = in_memory_store::file(&this->store_);
  mock_database::mock_database(&this->db_,file);
  pstore::database::set_vacuum_mode(&(this->db_).super_database,disabled);
  return;
}

Assistant:

Transaction::Transaction ()
            : db_{store_.file ()} {
        db_.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
    }